

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

vector4 * vector4_subtract(vector4 *self,vector4 *vT)

{
  vector4 *vT_local;
  vector4 *self_local;
  
  (self->field_0).v[0] = (self->field_0).v[0] - (vT->field_0).v[0];
  (self->field_0).v[1] = (self->field_0).v[1] - (vT->field_0).v[1];
  (self->field_0).v[2] = (self->field_0).v[2] - (vT->field_0).v[2];
  (self->field_0).v[3] = (self->field_0).v[3] - (vT->field_0).v[3];
  return self;
}

Assistant:

HYPAPI struct vector4 *vector4_subtract(struct vector4 *self, const struct vector4 *vT)
{
	self->v[0] -= vT->v[0];
	self->v[1] -= vT->v[1];
	self->v[2] -= vT->v[2];
	self->v[3] -= vT->v[3];
	return self;
}